

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

pair<const_char_*,_bool> __thiscall
google::protobuf::internal::EpsCopyInputStream::DoneFallback
          (EpsCopyInputStream *this,int overrun,int depth)

{
  char *pcVar1;
  char *pcVar2;
  int *piVar3;
  LogMessage *pLVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  pair<const_char_*,_bool> pVar6;
  bool local_221;
  int local_220;
  bool local_21b;
  LogFinisher local_21a;
  byte local_219;
  LogMessage local_218;
  bool local_1d9;
  void *local_1d8;
  LogFinisher local_1ca;
  byte local_1c9;
  LogMessage local_1c8;
  char *local_190;
  char *p;
  LogMessage local_180;
  LogFinisher local_142;
  byte local_141;
  LogMessage local_140;
  LogFinisher local_102;
  byte local_101;
  LogMessage local_100;
  int local_c8;
  LogFinisher local_c2;
  byte local_c1;
  LogMessage local_c0;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  bool local_31;
  void *local_30;
  int local_28;
  int local_24;
  int depth_local;
  int overrun_local;
  EpsCopyInputStream *this_local;
  bool local_10;
  
  local_28 = depth;
  local_24 = overrun;
  _depth_local = this;
  if (this->limit_ < overrun) {
    local_30 = (void *)0x0;
    local_31 = true;
    std::pair<const_char_*,_bool>::pair<std::nullptr_t,_bool,_true>
              ((pair<const_char_*,_bool> *)&this_local,&local_30,&local_31);
    uVar5 = extraout_RDX;
  }
  else {
    local_71 = 0;
    if (overrun == this->limit_) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                 ,0xaf);
      local_71 = 1;
      pLVar4 = LogMessage::operator<<(&local_70,"CHECK failed: overrun != limit_: ");
      LogFinisher::operator=(local_85,pLVar4);
    }
    if ((local_71 & 1) != 0) {
      LogMessage::~LogMessage(&local_70);
    }
    local_c1 = 0;
    if (this->limit_ <= local_24) {
      LogMessage::LogMessage
                (&local_c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                 ,0xb0);
      local_c1 = 1;
      pLVar4 = LogMessage::operator<<(&local_c0,"CHECK failed: overrun < limit_: ");
      LogFinisher::operator=(&local_c2,pLVar4);
    }
    if ((local_c1 & 1) != 0) {
      LogMessage::~LogMessage(&local_c0);
    }
    pcVar1 = this->limit_end_;
    pcVar2 = this->buffer_end_;
    local_c8 = 0;
    piVar3 = std::min<int>(&local_c8,&this->limit_);
    local_101 = 0;
    if (pcVar1 != pcVar2 + *piVar3) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                 ,0xb5);
      local_101 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_100,
                          "CHECK failed: limit_end_ == buffer_end_ + (std::min)(0, limit_): ");
      LogFinisher::operator=(&local_102,pLVar4);
    }
    if ((local_101 & 1) != 0) {
      LogMessage::~LogMessage(&local_100);
    }
    local_141 = 0;
    if (this->limit_ < 1) {
      LogMessage::LogMessage
                (&local_140,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                 ,0xb7);
      local_141 = 1;
      pLVar4 = LogMessage::operator<<(&local_140,"CHECK failed: limit_ > 0: ");
      LogFinisher::operator=(&local_142,pLVar4);
    }
    if ((local_141 & 1) != 0) {
      LogMessage::~LogMessage(&local_140);
    }
    p._7_1_ = 0;
    if (this->limit_end_ != this->buffer_end_) {
      LogMessage::LogMessage
                (&local_180,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                 ,0xb8);
      p._7_1_ = 1;
      pLVar4 = LogMessage::operator<<(&local_180,"CHECK failed: limit_end_ == buffer_end_: ");
      LogFinisher::operator=((LogFinisher *)((long)&p + 6),pLVar4);
    }
    if ((p._7_1_ & 1) != 0) {
      LogMessage::~LogMessage(&local_180);
    }
    do {
      local_1c9 = 0;
      if (local_24 < 0) {
        LogMessage::LogMessage
                  (&local_1c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                   ,0xbc);
        local_1c9 = 1;
        pLVar4 = LogMessage::operator<<(&local_1c8,"CHECK failed: overrun >= 0: ");
        LogFinisher::operator=(&local_1ca,pLVar4);
      }
      if ((local_1c9 & 1) != 0) {
        LogMessage::~LogMessage(&local_1c8);
      }
      local_190 = NextBuffer(this,local_24,local_28);
      if (local_190 == (char *)0x0) {
        if (local_24 == 0) {
          local_219 = 0;
          if (this->limit_ < 1) {
            LogMessage::LogMessage
                      (&local_218,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                       ,0xc1);
            local_219 = 1;
            pLVar4 = LogMessage::operator<<(&local_218,"CHECK failed: limit_ > 0: ");
            LogFinisher::operator=(&local_21a,pLVar4);
          }
          if ((local_219 & 1) != 0) {
            LogMessage::~LogMessage(&local_218);
          }
          this->limit_end_ = this->buffer_end_;
          SetEndOfStream(this);
          local_21b = true;
          std::pair<const_char_*,_bool>::pair<const_char_*&,_bool,_true>
                    ((pair<const_char_*,_bool> *)&this_local,&this->buffer_end_,&local_21b);
          uVar5 = extraout_RDX_01;
        }
        else {
          local_1d8 = (void *)0x0;
          local_1d9 = true;
          std::pair<const_char_*,_bool>::pair<std::nullptr_t,_bool,_true>
                    ((pair<const_char_*,_bool> *)&this_local,&local_1d8,&local_1d9);
          uVar5 = extraout_RDX_00;
        }
        goto LAB_00506f39;
      }
      this->limit_ = this->limit_ - ((int)this->buffer_end_ - (int)local_190);
      local_190 = local_190 + local_24;
      local_24 = (int)local_190 - (int)this->buffer_end_;
    } while (-1 < local_24);
    pcVar1 = this->buffer_end_;
    local_220 = 0;
    piVar3 = std::min<int>(&local_220,&this->limit_);
    this->limit_end_ = pcVar1 + *piVar3;
    local_221 = false;
    std::pair<const_char_*,_bool>::pair<const_char_*&,_bool,_true>
              ((pair<const_char_*,_bool> *)&this_local,&local_190,&local_221);
    uVar5 = extraout_RDX_02;
  }
LAB_00506f39:
  pVar6._9_7_ = (undefined7)((ulong)uVar5 >> 8);
  pVar6.second = local_10;
  pVar6.first = (char *)this_local;
  return pVar6;
}

Assistant:

std::pair<const char*, bool> EpsCopyInputStream::DoneFallback(int overrun,
                                                              int depth) {
  // Did we exceeded the limit (parse error).
  if (PROTOBUF_PREDICT_FALSE(overrun > limit_)) return {nullptr, true};
  GOOGLE_DCHECK(overrun != limit_);  // Guaranteed by caller.
  GOOGLE_DCHECK(overrun < limit_);   // Follows from above
  // TODO(gerbens) Instead of this dcheck we could just assign, and remove
  // updating the limit_end from PopLimit, ie.
  // limit_end_ = buffer_end_ + (std::min)(0, limit_);
  // if (ptr < limit_end_) return {ptr, false};
  GOOGLE_DCHECK(limit_end_ == buffer_end_ + (std::min)(0, limit_));
  // At this point we know the following assertion holds.
  GOOGLE_DCHECK(limit_ > 0);
  GOOGLE_DCHECK(limit_end_ == buffer_end_);  // because limit_ > 0
  const char* p;
  do {
    // We are past the end of buffer_end_, in the slop region.
    GOOGLE_DCHECK(overrun >= 0);
    p = NextBuffer(overrun, depth);
    if (p == nullptr) {
      // We are at the end of the stream
      if (PROTOBUF_PREDICT_FALSE(overrun != 0)) return {nullptr, true};
      GOOGLE_DCHECK(limit_ > 0);
      limit_end_ = buffer_end_;
      // Distinguish ending on a pushed limit or ending on end-of-stream.
      SetEndOfStream();
      return {buffer_end_, true};
    }
    limit_ -= buffer_end_ - p;  // Adjust limit_ relative to new anchor
    p += overrun;
    overrun = p - buffer_end_;
  } while (overrun >= 0);
  limit_end_ = buffer_end_ + std::min(0, limit_);
  return {p, false};
}